

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

void rgbcx::encode_bc1_solid_block(void *pDst,uint32_t fr,uint32_t fg,uint32_t fb,bool allow_3color)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  undefined2 uVar7;
  uint uVar8;
  undefined7 in_register_00000081;
  
  lVar1 = (ulong)fr * 3;
  if ((int)CONCAT71(in_register_00000081,allow_3color) != 0) {
    lVar2 = (ulong)fg * 3;
    lVar3 = (ulong)fb * 3;
    if ((uint)(byte)g_bc1_match5_half[lVar3 + 2] +
        (uint)(byte)g_bc1_match6_half[lVar2 + 2] + (uint)(byte)g_bc1_match5_half[lVar1 + 2] <
        (uint)(byte)g_bc1_match5_equals_1[lVar3 + 2] +
        (uint)(byte)g_bc1_match6_equals_1[lVar2 + 2] + (uint)(byte)g_bc1_match5_equals_1[lVar1 + 2])
    {
      uVar8 = (uint)(byte)g_bc1_match5_half[lVar3] |
              (uint)(byte)g_bc1_match6_half[lVar2] << 5 |
              (uint)(byte)g_bc1_match5_half[lVar1] << 0xb;
      uVar5 = (uint)(byte)g_bc1_match5_half[lVar3 + 1] |
              (uint)(byte)g_bc1_match6_half[lVar2 + 1] << 5 |
              (uint)(byte)g_bc1_match5_half[lVar1 + 1] << 0xb;
      uVar6 = uVar5;
      if (uVar8 < uVar5) {
        uVar6 = uVar8;
      }
      uVar7 = (undefined2)uVar6;
      if (uVar5 < uVar8) {
        uVar5 = uVar8;
      }
      bVar4 = 0xaa;
      goto LAB_00117dda;
    }
  }
  uVar6 = (uint)(byte)g_bc1_match5_equals_1[(ulong)fb * 3] |
          (uint)(byte)g_bc1_match6_equals_1[(ulong)fg * 3] << 5 |
          (uint)(byte)g_bc1_match5_equals_1[lVar1] << 0xb;
  uVar5 = (uint)(byte)g_bc1_match5_equals_1[(ulong)fb * 3 + 1] |
          (uint)(byte)g_bc1_match6_equals_1[(ulong)fg * 3 + 1] << 5 |
          (uint)(byte)g_bc1_match5_equals_1[lVar1 + 1] << 0xb;
  bVar4 = 0xaa;
  if (uVar5 == uVar6) {
    if (uVar6 == 0) {
      bVar4 = 0x55;
      uVar5 = 0;
      uVar7 = 1;
      goto LAB_00117dda;
    }
    uVar5 = uVar6 - 1;
    bVar4 = 0;
  }
  if (uVar6 < uVar5) {
    bVar4 = bVar4 | 0x55;
    uVar7 = (undefined2)uVar5;
    uVar5 = uVar6;
  }
  else {
    uVar7 = (undefined2)uVar6;
  }
LAB_00117dda:
  *(char *)pDst = (char)uVar7;
  *(char *)((long)pDst + 1) = (char)((ushort)uVar7 >> 8);
  *(char *)((long)pDst + 2) = (char)uVar5;
  *(char *)((long)pDst + 3) = (char)(uVar5 >> 8);
  *(uint *)((long)pDst + 4) = (uint)bVar4 * 0x1010101;
  return;
}

Assistant:

void encode_bc1_solid_block(void* pDst, uint32_t fr, uint32_t fg, uint32_t fb, bool allow_3color) 
	{
		bc1_block* pDst_block = static_cast<bc1_block*>(pDst);

		uint32_t mask = 0xAA;
		int max16 = -1, min16 = 0;

		if (allow_3color)
		{
			const uint32_t err4 = g_bc1_match5_equals_1[fr].m_e + g_bc1_match6_equals_1[fg].m_e + g_bc1_match5_equals_1[fb].m_e;
			const uint32_t err3 = g_bc1_match5_half[fr].m_e + g_bc1_match6_half[fg].m_e + g_bc1_match5_half[fb].m_e;

			if (err3 < err4)
			{
				max16 = (g_bc1_match5_half[fr].m_hi << 11) | (g_bc1_match6_half[fg].m_hi << 5) | g_bc1_match5_half[fb].m_hi;
				min16 = (g_bc1_match5_half[fr].m_lo << 11) | (g_bc1_match6_half[fg].m_lo << 5) | g_bc1_match5_half[fb].m_lo;

				if (max16 > min16)
					std::swap(max16, min16);
			}
		}

		if (max16 == -1)
		{
			max16 = (g_bc1_match5_equals_1[fr].m_hi << 11) | (g_bc1_match6_equals_1[fg].m_hi << 5) | g_bc1_match5_equals_1[fb].m_hi;
			min16 = (g_bc1_match5_equals_1[fr].m_lo << 11) | (g_bc1_match6_equals_1[fg].m_lo << 5) | g_bc1_match5_equals_1[fb].m_lo;

			if (min16 == max16)
			{
				// Always forbid 3 color blocks
				// This is to guarantee that BC3 blocks never use punchthrough alpha (3 color) mode, which isn't supported on some (all?) GPU's.
				mask = 0;

				// Make l > h
				if (min16 > 0)
					min16--;
				else
				{
					// l = h = 0
					assert(min16 == max16 && max16 == 0);

					max16 = 1;
					min16 = 0;
					mask = 0x55;
				}

				assert(max16 > min16);
			}

			if (max16 < min16)
			{
				std::swap(max16, min16);
				mask ^= 0x55;
			}
		}

		pDst_block->set_low_color(static_cast<uint16_t>(max16));
		pDst_block->set_high_color(static_cast<uint16_t>(min16));
		pDst_block->m_selectors[0] = static_cast<uint8_t>(mask);
		pDst_block->m_selectors[1] = static_cast<uint8_t>(mask);
		pDst_block->m_selectors[2] = static_cast<uint8_t>(mask);
		pDst_block->m_selectors[3] = static_cast<uint8_t>(mask);
	}